

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

json __thiscall inja::Environment::load_json(Environment *this,string *filename)

{
  FileError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  json_value extraout_RDX;
  json jVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> first;
  path local_2f8;
  path local_2d0;
  _Any_data local_2a8;
  undefined8 local_298;
  undefined8 uStack_290;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream file;
  byte abStack_208 [200];
  undefined8 auStack_140 [36];
  
  ::std::ifstream::ifstream(&file);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_2f8,in_RDX,auto_format);
  std::filesystem::__cxx11::operator/(&local_2d0,(path *)(filename + 0x14),&local_2f8);
  ::std::ifstream::open((char *)&file,(_Ios_Openmode)local_2d0._M_pathname._M_dataplus._M_p);
  std::filesystem::__cxx11::path::~path(&local_2d0);
  std::filesystem::__cxx11::path::~path(&local_2f8);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    local_2a8._M_unused._M_object = (void *)0x0;
    local_2a8._8_8_ = 0;
    local_298 = 0;
    uStack_290 = 0;
    first._8_8_ = *(undefined8 *)((long)auStack_140 + *(long *)(_file + -0x18));
    first._M_sbuf = (streambuf_type *)this;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::istreambuf_iterator<char,std::char_traits<char>>>
              (first,(istreambuf_iterator<char,_std::char_traits<char>_>)ZEXT816(0xffffffffffffffff)
               ,(parser_callback_t *)0xffffffff,SUB81(&local_2a8,0),true);
    std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
    ::std::ifstream::~ifstream(&file);
    jVar1.m_data.m_value.object = extraout_RDX.object;
    jVar1.m_data._0_8_ = this;
    return (json)jVar1.m_data;
  }
  this_00 = (FileError *)__cxa_allocate_exception(0x60);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_2f8,in_RDX,auto_format);
  std::filesystem::__cxx11::operator/(&local_2d0,(path *)(filename + 0x14),&local_2f8);
  std::filesystem::__cxx11::path::string(&local_288,&local_2d0);
  ::std::operator+(&local_268,"failed accessing file at \'",&local_288);
  ::std::operator+(&local_248,&local_268,"\'");
  FileError::FileError(this_00,&local_248);
  __cxa_throw(this_00,&FileError::typeinfo,InjaError::~InjaError);
}

Assistant:

json load_json(const std::string& filename) {
    std::ifstream file;
    file.open(input_path / filename);
    if (file.fail()) {
      INJA_THROW(FileError("failed accessing file at '" + (input_path / filename).string() + "'"));
    }

    return json::parse(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>());
  }